

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O0

void regen_monster(monster_conflict *mon,wchar_t num)

{
  _Bool _Var1;
  int local_18;
  wchar_t frac;
  wchar_t num_local;
  monster_conflict *mon_local;
  
  if (mon->hp < mon->maxhp) {
    local_18 = (int)mon->maxhp / 100;
    if (local_18 == 0) {
      local_18 = 1;
    }
    _Var1 = flag_has_dbg(mon->race->flags,0xc,0x18,"mon->race->flags","RF_REGENERATE");
    if (_Var1) {
      local_18._0_2_ = (short)(local_18 << 1);
    }
    mon->hp = mon->hp + (short)num * (short)local_18;
    if (mon->maxhp < mon->hp) {
      mon->hp = mon->maxhp;
    }
    if ((monster_conflict *)player->upkeep->health_who == mon) {
      player->upkeep->redraw = player->upkeep->redraw | 0x200;
    }
  }
  return;
}

Assistant:

static void regen_monster(struct monster *mon, int num)
{
	/* Regenerate (if needed) */
	if (mon->hp < mon->maxhp) {
		/* Base regeneration */
		int frac = mon->maxhp / 100;

		/* Minimal regeneration rate */
		if (!frac) frac = 1;

		/* Some monsters regenerate quickly */
		if (rf_has(mon->race->flags, RF_REGENERATE)) frac *= 2;

		/* Multiply by number of regenerations */
		frac *= num;

		/* Regenerate */
		mon->hp += frac;

		/* Do not over-regenerate */
		if (mon->hp > mon->maxhp) mon->hp = mon->maxhp;

		/* Redraw (later) if needed */
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);
	}
}